

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 DateFormat(jx9_context *pCtx,char *zIn,int nLen,Sytm *pTm)

{
  uint uVar1;
  int in_EAX;
  uint uVar2;
  long lVar3;
  char **ppcVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  byte *pbVar8;
  bool bVar9;
  time_t tt;
  
  pbVar8 = (byte *)(zIn + nLen);
  do {
    if (pbVar8 <= zIn) {
      return in_EAX;
    }
    uVar2 = (byte)*zIn - 0x41;
    if (0x39 < uVar2) {
switchD_00131075_caseD_42:
      iVar5 = 1;
      pcVar7 = zIn;
      goto LAB_0013138f;
    }
    in_EAX = (&switchD_00131075::switchdataD_00139700)[uVar2] + 0x139700;
    switch((uint)(byte)*zIn) {
    case 0x41:
      if (pTm->tm_hour < 0xd) {
        pcVar7 = "AM";
      }
      else {
        pcVar7 = "PM";
      }
      goto LAB_00131389;
    default:
      goto switchD_00131075_caseD_42;
    case 0x44:
      iVar5 = pTm->tm_wday % 7;
      ppcVar4 = zEngDay;
      goto LAB_00131272;
    case 0x46:
      iVar5 = pTm->tm_mon % 0xc;
      ppcVar4 = zEngMonth;
      goto LAB_00131259;
    case 0x47:
      uVar6 = (ulong)(uint)pTm->tm_hour;
      break;
    case 0x48:
      uVar6 = (ulong)(uint)pTm->tm_hour;
      goto LAB_0013134d;
    case 0x49:
      bVar9 = pTm->tm_isdst == 1;
LAB_00131283:
      uVar6 = (ulong)bVar9;
      break;
    case 0x4c:
      uVar2 = pTm->tm_year;
      uVar6 = 1;
      if ((int)uVar2 % 400 != 0) {
        if ((int)uVar2 % 100 != 0) {
          bVar9 = (uVar2 & 3) == 0;
          goto LAB_00131283;
        }
        uVar6 = 0;
      }
      break;
    case 0x4d:
      iVar5 = pTm->tm_mon % 0xc;
      ppcVar4 = zEngMonth;
LAB_00131272:
      pcVar7 = ppcVar4[iVar5];
      iVar5 = 3;
      goto LAB_0013138f;
    case 0x4e:
      uVar6 = (ulong)(uint)aISO8601[pTm->tm_wday % 7];
      break;
    case 0x4f:
    case 0x50:
    case 0x5a:
      in_EAX = jx9_result_string_format(pCtx,"%+05d",pTm->tm_gmtoff);
      goto LAB_00131394;
    case 0x53:
      uVar6 = (long)pTm->tm_mday / 10;
      if ((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) % 10) == 1) {
        lVar3 = 0;
      }
      else {
        lVar3 = (long)((pTm->tm_mday % 10) * 2);
      }
      pcVar7 = "thstndrdthththththth" + lVar3;
      goto LAB_00131389;
    case 0x55:
      time(&tt);
      uVar2 = (uint)tt;
      goto LAB_001312f4;
    case 0x59:
    case 0x6f:
      uVar6 = (ulong)(uint)pTm->tm_year;
      pcVar7 = "%4d";
      goto LAB_00131357;
    case 0x5c:
      pcVar7 = (char *)((byte *)zIn + 1);
      zIn = pcVar7;
      if (pbVar8 <= pcVar7) goto LAB_00131394;
      iVar5 = 1;
      goto LAB_0013138f;
    case 0x61:
      if (pTm->tm_hour < 0xd) {
        pcVar7 = "am";
      }
      else {
        pcVar7 = "pm";
      }
LAB_00131389:
      iVar5 = 2;
LAB_0013138f:
      in_EAX = jx9_result_string(pCtx,pcVar7,iVar5);
      goto LAB_00131394;
    case 99:
      in_EAX = jx9_result_string_format
                         (pCtx,"%4d-%02d-%02dT%02d:%02d:%02d%+05d",(ulong)(uint)pTm->tm_year,
                          (ulong)(pTm->tm_mon + 1),(ulong)(uint)pTm->tm_mday,
                          (ulong)(uint)pTm->tm_hour,(ulong)(uint)pTm->tm_min,
                          (ulong)(uint)pTm->tm_sec,pTm->tm_gmtoff);
      goto LAB_00131394;
    case 100:
      uVar6 = (ulong)(uint)pTm->tm_mday;
      goto LAB_0013134d;
    case 0x65:
      pcVar7 = "GMT";
      if ((byte *)pTm->tm_zone != (byte *)0x0) {
        pcVar7 = pTm->tm_zone;
      }
      goto LAB_00131336;
    case 0x67:
      iVar5 = pTm->tm_hour % 0xc;
      goto LAB_0013133d;
    case 0x68:
      iVar5 = pTm->tm_hour % 0xc;
      goto LAB_0013134b;
    case 0x69:
      uVar6 = (ulong)(uint)pTm->tm_min;
      goto LAB_0013134d;
    case 0x6a:
      uVar6 = (ulong)(uint)pTm->tm_mday;
      break;
    case 0x6c:
      iVar5 = pTm->tm_wday % 7;
      ppcVar4 = zEngDay;
LAB_00131259:
      pcVar7 = ppcVar4[iVar5];
LAB_00131336:
      iVar5 = -1;
      goto LAB_0013138f;
    case 0x6d:
      iVar5 = pTm->tm_mon;
LAB_0013134b:
      uVar6 = (ulong)(iVar5 + 1);
      goto LAB_0013134d;
    case 0x6e:
      iVar5 = pTm->tm_mon;
LAB_0013133d:
      uVar6 = (ulong)(iVar5 + 1);
      break;
    case 0x72:
      in_EAX = jx9_result_string_format
                         (pCtx,"%.3s, %02d %.3s %4d %02d:%02d:%02d",zEngDay[pTm->tm_wday % 7],
                          (ulong)(uint)pTm->tm_mday,zEngMonth[pTm->tm_mon % 0xc],
                          (ulong)(uint)pTm->tm_year,(ulong)(uint)pTm->tm_hour,
                          (ulong)(uint)pTm->tm_min,(ulong)(uint)pTm->tm_sec);
      goto LAB_00131394;
    case 0x73:
      uVar6 = (ulong)(uint)pTm->tm_sec;
      goto LAB_0013134d;
    case 0x74:
      uVar2 = DateFormat::aMonDays[pTm->tm_mon % 0xc];
      if ((pTm->tm_mon == 1) && (uVar1 = pTm->tm_year, (int)uVar1 % 400 != 0)) {
        if ((uVar1 & 3) != 0) {
          uVar2 = 0x1c;
        }
        if ((int)uVar1 % 100 == 0) {
          uVar2 = 0x1c;
        }
      }
      pcVar7 = "%d";
      uVar6 = (ulong)uVar2;
      goto LAB_00131357;
    case 0x75:
      uVar2 = pTm->tm_sec * 1000000;
LAB_001312f4:
      uVar6 = (ulong)uVar2;
      pcVar7 = "%u";
      goto LAB_00131357;
    case 0x77:
      uVar6 = (ulong)(uint)pTm->tm_wday;
      break;
    case 0x79:
      uVar6 = (long)pTm->tm_year % 100 & 0xffffffff;
LAB_0013134d:
      pcVar7 = "%02d";
      goto LAB_00131357;
    case 0x7a:
      uVar6 = (ulong)(uint)pTm->tm_yday;
    }
    pcVar7 = "%d";
LAB_00131357:
    in_EAX = jx9_result_string_format(pCtx,pcVar7,uVar6);
LAB_00131394:
    zIn = (char *)((byte *)zIn + 1);
  } while( true );
}

Assistant:

static sxi32 DateFormat(jx9_context *pCtx, const char *zIn, int nLen, Sytm *pTm)
{
	const char *zEnd = &zIn[nLen];
	const char *zCur;
	/* Start the format process */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		switch(zIn[0]){
		case 'd':
			/* Day of the month, 2 digits with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mday);
			break;
		case 'D':
			/*A textual representation of a day, three letters*/
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'j':
			/*	Day of the month without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_mday);
			break;
		case 'l':
			/* A full textual representation of the day of the week */
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'N':{
			/* ISO-8601 numeric representation of the day of the week */
			jx9_result_string_format(pCtx, "%d", aISO8601[pTm->tm_wday % 7 ]);
			break;
				 }
		case 'w':
			/*Numeric representation of the day of the week*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_wday);
			break;
		case 'z':
			/*The day of the year*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_yday);
			break;
		case 'F':
			/*A full textual representation of a month, such as January or March*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'm':
			/*Numeric representation of a month, with leading zeros*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mon + 1);
			break;
		case 'M':
			/*A short textual representation of a month, three letters*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'n':
			/*Numeric representation of a month, without leading zeros*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_mon + 1);
			break;
		case 't':{
			static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
			int nDays = aMonDays[pTm->tm_mon % 12 ];
			if( pTm->tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(pTm->tm_year) ){
				nDays = 28;
			}
			/*Number of days in the given month*/
			jx9_result_string_format(pCtx, "%d", nDays);
			break;
				 }
		case 'L':{
			int isLeap = IS_LEAP_YEAR(pTm->tm_year);
			/* Whether it's a leap year */
			jx9_result_string_format(pCtx, "%d", isLeap);
			break;
				 }
		case 'o':
			/* ISO-8601 year number.*/
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'Y':
			/*	A full numeric representation of a year, 4 digits */
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'y':
			/*A two digit representation of a year*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_year%100);
			break;
		case 'a':
			/*	Lowercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "pm" : "am", 2);
			break;
		case 'A':
			/*	Uppercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "PM" : "AM", 2);
			break;
		case 'g':
			/*	12-hour format of an hour without leading zeros*/
			jx9_result_string_format(pCtx, "%d", 1+(pTm->tm_hour%12));
			break;
		case 'G':
			/* 24-hour format of an hour without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_hour);
			break;
		case 'h':
			/* 12-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", 1+(pTm->tm_hour%12));
			break;
		case 'H':
			/*	24-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_hour);
			break;
		case 'i':
			/* 	Minutes with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_min);
			break;
		case 's':
			/* 	second with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_sec);
			break;
		case 'u':
			/* 	Microseconds */
			jx9_result_string_format(pCtx, "%u", pTm->tm_sec * SX_USEC_PER_SEC);
			break;
		case 'S':{
			/* English ordinal suffix for the day of the month, 2 characters */
			static const char zSuffix[] = "thstndrdthththththth";
			int v = pTm->tm_mday;
			jx9_result_string(pCtx, &zSuffix[2 * (int)(v / 10 % 10 != 1 ? v % 10 : 0)], (int)sizeof(char) * 2);
			break;
				 }
		case 'e':
			/* 	Timezone identifier */
			zCur = pTm->tm_zone;
			if( zCur == 0 ){
				/* Assume GMT */
				zCur = "GMT";
			}
			jx9_result_string(pCtx, zCur, -1);
			break;
		case 'I':
			/* Whether or not the date is in daylight saving time */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&pTm->tm_isdst);
#endif
#endif
#endif
			jx9_result_string_format(pCtx, "%d", pTm->tm_isdst == 1);
			break;
		case 'r':
			/* RFC 2822 formatted date 	Example: Thu, 21 Dec 2000 16:01:07 */
			jx9_result_string_format(pCtx, "%.3s, %02d %.3s %4d %02d:%02d:%02d", 
				SyTimeGetDay(pTm->tm_wday), 
				pTm->tm_mday, 
				SyTimeGetMonth(pTm->tm_mon), 
				pTm->tm_year, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec
				);
			break;
		case 'U':{
			time_t tt;
			/* Seconds since the Unix Epoch */
			time(&tt);
			jx9_result_string_format(pCtx, "%u", (unsigned int)tt);
			break;
				 }
		case 'O':
		case 'P':
			/* Difference to Greenwich time (GMT) in hours */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'Z':
			/* Timezone offset in seconds. The offset for timezones west of UTC
			 * is always negative, and for those east of UTC is always positive.
			 */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'c':
			/* 	ISO 8601 date */
			jx9_result_string_format(pCtx, "%4d-%02d-%02dT%02d:%02d:%02d%+05d", 
				pTm->tm_year, 
				pTm->tm_mon+1, 
				pTm->tm_mday, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec, 
				pTm->tm_gmtoff
				);
			break;
		case '\\':
			zIn++;
			/* Expand verbatim */
			if( zIn < zEnd ){
				jx9_result_string(pCtx, zIn, (int)sizeof(char));
			}
			break;
		default:
			/* Unknown format specifer, expand verbatim */
			jx9_result_string(pCtx, zIn, (int)sizeof(char));
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	return SXRET_OK;
}